

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O0

uint crnlib::pixel_format_helpers::get_bpp(pixel_format fmt)

{
  pixel_format fmt_local;
  undefined4 local_4;
  
  if (fmt == PIXEL_FMT_ETC1) {
    local_4 = 4;
  }
  else if (fmt == PIXEL_FMT_DXT5A) {
    local_4 = 4;
  }
  else if (fmt == PIXEL_FMT_DXT1) {
    local_4 = 4;
  }
  else if (fmt == PIXEL_FMT_ETC2) {
    local_4 = 4;
  }
  else if (fmt == PIXEL_FMT_3DC) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT2) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT3) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT4) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT5) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT1A) {
    local_4 = 4;
  }
  else if (fmt == PIXEL_FMT_ETC2A) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_A8R8G8B8) {
    local_4 = 0x20;
  }
  else if (fmt == PIXEL_FMT_A8L8) {
    local_4 = 0x10;
  }
  else if (fmt == PIXEL_FMT_A8) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT5_AGBR) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT5_xGBR) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT5_xGxR) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_ETC1S) {
    local_4 = 4;
  }
  else if (fmt == PIXEL_FMT_ETC2AS) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXN) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_DXT5_CCxY) {
    local_4 = 8;
  }
  else if (fmt == PIXEL_FMT_R8G8B8) {
    local_4 = 0x18;
  }
  else if (fmt == PIXEL_FMT_L8) {
    local_4 = 8;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline uint get_bpp(pixel_format fmt) {
  switch (fmt) {
    case PIXEL_FMT_DXT1:
      return 4;
    case PIXEL_FMT_DXT1A:
      return 4;
    case PIXEL_FMT_ETC1:
      return 4;
    case PIXEL_FMT_ETC2:
      return 4;
    case PIXEL_FMT_ETC2A:
      return 8;
    case PIXEL_FMT_ETC1S:
      return 4;
    case PIXEL_FMT_ETC2AS:
      return 8;
    case PIXEL_FMT_DXT2:
      return 8;
    case PIXEL_FMT_DXT3:
      return 8;
    case PIXEL_FMT_DXT4:
      return 8;
    case PIXEL_FMT_DXT5:
      return 8;
    case PIXEL_FMT_3DC:
      return 8;
    case PIXEL_FMT_DXT5A:
      return 4;
    case PIXEL_FMT_R8G8B8:
      return 24;
    case PIXEL_FMT_A8R8G8B8:
      return 32;
    case PIXEL_FMT_A8:
      return 8;
    case PIXEL_FMT_L8:
      return 8;
    case PIXEL_FMT_A8L8:
      return 16;
    case PIXEL_FMT_DXN:
      return 8;
    case PIXEL_FMT_DXT5_CCxY:
      return 8;
    case PIXEL_FMT_DXT5_xGxR:
      return 8;
    case PIXEL_FMT_DXT5_xGBR:
      return 8;
    case PIXEL_FMT_DXT5_AGBR:
      return 8;
    default:
      break;
  }
  CRNLIB_ASSERT(false);
  return 0;
}